

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O3

QBitArray * __thiscall
QHeaderViewPrivate::sectionsHiddenToBitVector
          (QBitArray *__return_storage_ptr__,QHeaderViewPrivate *this)

{
  uint uVar1;
  Data *pDVar2;
  byte *pbVar3;
  byte bVar4;
  qsizetype extraout_RDX;
  QBitArray *ba;
  R_conflict2 RVar5;
  qsizetype i;
  
  (__return_storage_ptr__->d).d.d = (Data *)0x0;
  (__return_storage_ptr__->d).d.ptr = (char *)0x0;
  (__return_storage_ptr__->d).d.size = 0;
  pDVar2 = (this->hiddenSectionSize).d;
  if ((pDVar2 != (Data *)0x0) && (pDVar2->size != 0)) {
    QBitArray::resize((longlong)__return_storage_ptr__);
    if ((this->sectionItems).d.size != 0) {
      ba = (QBitArray *)0x0;
      i = extraout_RDX;
      do {
        uVar1 = *(uint *)((this->sectionItems).d.ptr + (long)ba);
        RVar5 = QBitArray::bitLocation<QBitArray>(__return_storage_ptr__,ba,i);
        pbVar3 = (byte *)RVar5.byte;
        if ((uVar1 >> 0x14 & 1) == 0) {
          bVar4 = ~RVar5.bitMask & *pbVar3;
        }
        else {
          bVar4 = RVar5.bitMask | *pbVar3;
        }
        i = CONCAT71(RVar5._9_7_,bVar4);
        *pbVar3 = bVar4;
        ba = (QBitArray *)((long)&(ba->d).d.d + 1);
      } while (ba < (QBitArray *)(this->sectionItems).d.size);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QBitArray sectionsHiddenToBitVector() const
    {
        QBitArray sectionHidden;
        if (!hiddenSectionSize.isEmpty()) {
            sectionHidden.resize(sectionItems.size());
            for (int u = 0; u < sectionItems.size(); ++u)
                sectionHidden[u] = sectionItems.at(u).isHidden;
        }
        return sectionHidden;
    }